

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacReporters.cpp
# Opt level: O0

void __thiscall ApprovalTests::Mac::MacDiffReporter::MacDiffReporter(MacDiffReporter *this)

{
  initializer_list<ApprovalTests::Reporter_*> __l;
  void *pvVar1;
  _func_int **pp_Var2;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *theReporters;
  iterator ppRVar3;
  allocator_type *__a;
  pointer ppRVar4;
  undefined8 *in_RDI;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *this_00;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *this_01;
  undefined8 *puVar5;
  FirstWorkingReporter *this_02;
  DiffMergeReporter *in_stack_ffffffffffffff30;
  KaleidoscopeReporter *this_03;
  void *local_80;
  void *local_78;
  void *local_70;
  undefined1 local_68 [40];
  undefined1 local_40 [64];
  
  pvVar1 = operator_new(0x121769);
  AraxisMergeReporter::AraxisMergeReporter((AraxisMergeReporter *)in_stack_ffffffffffffff30);
  local_80 = pvVar1;
  pvVar1 = operator_new(0x1217a8);
  BeyondCompareReporter::BeyondCompareReporter((BeyondCompareReporter *)in_stack_ffffffffffffff30);
  local_78 = pvVar1;
  pvVar1 = operator_new(0x1217e7);
  DiffMergeReporter::DiffMergeReporter(in_stack_ffffffffffffff30);
  this_03 = (KaleidoscopeReporter *)local_68;
  local_70 = pvVar1;
  pp_Var2 = (_func_int **)operator_new(0x121823);
  KaleidoscopeReporter::KaleidoscopeReporter(this_03);
  (this_03->super_GenericDiffReporter).super_CommandReporter.super_Reporter._vptr_Reporter = pp_Var2
  ;
  this_02 = (FirstWorkingReporter *)(local_68 + 8);
  pp_Var2 = (_func_int **)operator_new(0x121859);
  P4MergeReporter::P4MergeReporter((P4MergeReporter *)this_03);
  (this_02->super_Reporter)._vptr_Reporter = pp_Var2;
  puVar5 = (undefined8 *)(local_68 + 0x10);
  theReporters = (vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *)
                 operator_new(0x12188f);
  SublimeMergeReporter::SublimeMergeReporter((SublimeMergeReporter *)this_03);
  *puVar5 = theReporters;
  this_01 = (vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *)
            (local_68 + 0x18);
  ppRVar3 = (iterator)operator_new(0x1218c5);
  KDiff3Reporter::KDiff3Reporter((KDiff3Reporter *)this_03);
  (this_01->
  super__Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>)._M_impl
  .super__Vector_impl_data._M_start = ppRVar3;
  __a = (allocator_type *)operator_new(0x1218fb);
  TkDiffReporter::TkDiffReporter((TkDiffReporter *)this_03);
  this_00 = (vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *)
            local_40;
  local_68._32_8_ = __a;
  ppRVar4 = (pointer)operator_new(0x121931);
  VisualStudioCodeReporter::VisualStudioCodeReporter((VisualStudioCodeReporter *)this_03);
  (this_00->
  super__Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>)._M_impl
  .super__Vector_impl_data._M_start = ppRVar4;
  ppRVar4 = (pointer)operator_new(0x121967);
  CLionDiffReporter::CLionDiffReporter((CLionDiffReporter *)this_03);
  local_40._16_8_ = &local_80;
  local_40._24_8_ = 10;
  local_40._8_8_ = ppRVar4;
  ::std::allocator<ApprovalTests::Reporter_*>::allocator
            ((allocator<ApprovalTests::Reporter_*> *)0x1219b3);
  __l._M_len = (size_type)puVar5;
  __l._M_array = ppRVar3;
  ::std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::vector
            (this_01,__l,__a);
  FirstWorkingReporter::FirstWorkingReporter(this_02,theReporters);
  ::std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::~vector
            (this_00);
  ::std::allocator<ApprovalTests::Reporter_*>::~allocator
            ((allocator<ApprovalTests::Reporter_*> *)0x121a07);
  *in_RDI = &PTR__MacDiffReporter_001c2e48;
  return;
}

Assistant:

MacDiffReporter::MacDiffReporter()
            : FirstWorkingReporter({
                  // begin-snippet: mac_diff_reporters
                  new AraxisMergeReporter(),
                  new BeyondCompareReporter(),
                  new DiffMergeReporter(),
                  new KaleidoscopeReporter(),
                  new P4MergeReporter(),
                  new SublimeMergeReporter(),
                  new KDiff3Reporter(),
                  new TkDiffReporter(),
                  new VisualStudioCodeReporter(),
                  new CLionDiffReporter()
                  // end-snippet
              })
        {
        }